

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text_format.cc
# Opt level: O0

bool __thiscall
google::protobuf::MapEntryMessageComparator::operator()
          (MapEntryMessageComparator *this,Message *a,Message *b)

{
  bool bVar1;
  CppType CVar2;
  int32 iVar3;
  uint32 uVar4;
  int64 iVar5;
  uint64 uVar6;
  Reflection *this_00;
  LogMessage *in_RDI;
  string second_5;
  string first_5;
  uint64 second_4;
  uint64 first_4;
  uint32 second_3;
  uint32 first_3;
  int64 second_2;
  int64 first_2;
  int32 second_1;
  int32 first_1;
  bool second;
  bool first;
  Reflection *reflection;
  undefined4 in_stack_fffffffffffffee8;
  int in_stack_fffffffffffffeec;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffef0;
  LogMessage *this_01;
  FieldDescriptor *in_stack_fffffffffffffef8;
  FieldDescriptor *in_stack_ffffffffffffff10;
  Message *in_stack_ffffffffffffff18;
  Reflection *in_stack_ffffffffffffff20;
  string local_a0 [32];
  string local_80 [40];
  ulong local_58;
  uint local_4c;
  long local_40;
  int local_30;
  byte local_29;
  Reflection *local_28;
  byte local_1;
  
  local_28 = Message::GetReflection((Message *)in_stack_fffffffffffffef0);
  CVar2 = FieldDescriptor::cpp_type((FieldDescriptor *)0x46f331);
  this_00 = (Reflection *)(ulong)(CVar2 - CPPTYPE_INT32);
  switch(this_00) {
  case (Reflection *)0x0:
    local_30 = Reflection::GetInt32(this_00,(Message *)in_RDI,in_stack_fffffffffffffef8);
    iVar3 = Reflection::GetInt32(this_00,(Message *)in_RDI,in_stack_fffffffffffffef8);
    local_1 = local_30 < iVar3;
    break;
  case (Reflection *)0x1:
    local_40 = Reflection::GetInt64(this_00,(Message *)in_RDI,in_stack_fffffffffffffef8);
    iVar5 = Reflection::GetInt64(this_00,(Message *)in_RDI,in_stack_fffffffffffffef8);
    local_1 = local_40 < iVar5;
    break;
  case (Reflection *)0x2:
    local_4c = Reflection::GetUInt32(this_00,(Message *)in_RDI,in_stack_fffffffffffffef8);
    uVar4 = Reflection::GetUInt32(this_00,(Message *)in_RDI,in_stack_fffffffffffffef8);
    local_1 = local_4c < uVar4;
    break;
  case (Reflection *)0x3:
    local_58 = Reflection::GetUInt64(this_00,(Message *)in_RDI,in_stack_fffffffffffffef8);
    uVar6 = Reflection::GetUInt64(this_00,(Message *)in_RDI,in_stack_fffffffffffffef8);
    local_1 = local_58 < uVar6;
    break;
  default:
    this_01 = (LogMessage *)&stack0xffffffffffffff18;
    internal::LogMessage::LogMessage
              (in_RDI,(LogLevel_conflict)((ulong)in_stack_fffffffffffffef8 >> 0x20),(char *)this_01,
               in_stack_fffffffffffffeec);
    internal::LogMessage::operator<<
              (this_01,(char *)CONCAT44(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8));
    internal::LogFinisher::operator=
              ((LogFinisher *)this_01,
               (LogMessage *)CONCAT44(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8));
    internal::LogMessage::~LogMessage((LogMessage *)0x46f674);
    local_1 = 1;
    break;
  case (Reflection *)0x6:
    local_29 = Reflection::GetBool(this_00,(Message *)in_RDI,in_stack_fffffffffffffef8);
    bVar1 = Reflection::GetBool(this_00,(Message *)in_RDI,in_stack_fffffffffffffef8);
    local_1 = (local_29 & 1) < bVar1;
    break;
  case (Reflection *)0x8:
    Reflection::GetString_abi_cxx11_
              (in_stack_ffffffffffffff20,in_stack_ffffffffffffff18,in_stack_ffffffffffffff10);
    Reflection::GetString_abi_cxx11_
              (in_stack_ffffffffffffff20,in_stack_ffffffffffffff18,in_stack_ffffffffffffff10);
    local_1 = std::operator<(in_stack_fffffffffffffef0,
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             CONCAT44(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8));
    std::__cxx11::string::~string(local_a0);
    std::__cxx11::string::~string(local_80);
  }
  return (bool)(local_1 & 1);
}

Assistant:

bool operator()(const Message* a, const Message* b) {
    const Reflection* reflection = a->GetReflection();
    switch (field_->cpp_type()) {
      case FieldDescriptor::CPPTYPE_BOOL: {
        bool first = reflection->GetBool(*a, field_);
        bool second = reflection->GetBool(*b, field_);
        return first < second;
      }
      case FieldDescriptor::CPPTYPE_INT32: {
        int32 first = reflection->GetInt32(*a, field_);
        int32 second = reflection->GetInt32(*b, field_);
        return first < second;
      }
      case FieldDescriptor::CPPTYPE_INT64: {
        int64 first = reflection->GetInt64(*a, field_);
        int64 second = reflection->GetInt64(*b, field_);
        return first < second;
      }
      case FieldDescriptor::CPPTYPE_UINT32: {
        uint32 first = reflection->GetUInt32(*a, field_);
        uint32 second = reflection->GetUInt32(*b, field_);
        return first < second;
      }
      case FieldDescriptor::CPPTYPE_UINT64: {
        uint64 first = reflection->GetUInt64(*a, field_);
        uint64 second = reflection->GetUInt64(*b, field_);
        return first < second;
      }
      case FieldDescriptor::CPPTYPE_STRING: {
        std::string first = reflection->GetString(*a, field_);
        std::string second = reflection->GetString(*b, field_);
        return first < second;
      }
      default:
        GOOGLE_LOG(DFATAL) << "Invalid key for map field.";
        return true;
    }
  }